

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_fp.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  FILE *__s;
  bool bVar5;
  double dVar6;
  int flag;
  SUNContext ctx;
  SUNLogger logger;
  double local_a0;
  sunrealtype t;
  long netf;
  long nni;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  void *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long ncfn;
  
  ctx = (SUNContext)0x0;
  logger = (SUNLogger)0x0;
  bVar5 = true;
  if (argc == 2) {
    iVar2 = atoi(argv[1]);
    bVar5 = iVar2 == 0;
  }
  flag = SUNContext_Create(0,&ctx);
  iVar4 = 1;
  iVar2 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar2 == 0) {
    flag = SUNLogger_Create(0,0,&logger);
    iVar4 = 1;
    iVar2 = check_flag(&flag,"SUNLogger_Create",1);
    if (iVar2 == 0) {
      if (!bVar5) {
        flag = SUNLogger_SetInfoFilename(logger,"ark_brusselator_fp-info.txt");
        iVar2 = check_flag(&flag,"SUNLogger_SetInfoFilename",1);
        if (iVar2 != 0) {
          return 1;
        }
      }
      flag = SUNContext_SetLogger(ctx,logger);
      iVar4 = 1;
      iVar2 = check_flag(&flag,"SUNContext_SetLogger",1);
      if (iVar2 == 0) {
        puts("\nBrusselator ODE test problem, fixed-point solver:");
        printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0,0x4008000000000000,
               0x400c000000000000);
        printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",0,0x4008000000000000,
               0x3f40624dd2f1a9fc);
        printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0x3ddb7cdfd9d7bdbb);
        local_58 = 0;
        uStack_54 = 0x3fe00000;
        uStack_50 = 0;
        uStack_4c = 0x40080000;
        local_48 = 0x3f40624dd2f1a9fc;
        flagvalue = (long *)N_VNew_Serial(3,ctx);
        iVar2 = check_flag(flagvalue,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          puVar1 = *(undefined8 **)(*flagvalue + 0x10);
          *puVar1 = 0x4008000000000000;
          puVar1[1] = 0x4008000000000000;
          puVar1[2] = 0x400c000000000000;
          flagvalue_00 = (void *)ARKStepCreate(0,fe,fi,flagvalue,ctx);
          local_60 = flagvalue_00;
          iVar2 = check_flag(flagvalue_00,"ARKStepCreate",0);
          if (iVar2 == 0) {
            flagvalue_01 = (void *)SUNNonlinSol_FixedPoint(flagvalue,3,ctx);
            iVar2 = check_flag(flagvalue_01,"SUNNonlinSol_FixedPoint",0);
            if (iVar2 == 0) {
              flag = ARKodeSetNonlinearSolver(flagvalue_00,flagvalue_01);
              iVar4 = 1;
              iVar2 = check_flag(&flag,"ARKodeSetNonlinearSolver",1);
              if (iVar2 == 0) {
                flag = ARKodeSetUserData(flagvalue_00,&local_58);
                iVar4 = 1;
                iVar2 = check_flag(&flag,"ARKodeSetUserData",1);
                if (iVar2 == 0) {
                  flag = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,flagvalue_00);
                  iVar4 = 1;
                  iVar2 = check_flag(&flag,"ARKodeSStolerances",1);
                  if (iVar2 == 0) {
                    iVar2 = 10;
                    flag = ARKodeSetMaxNonlinIters(flagvalue_00,10);
                    iVar4 = 1;
                    iVar3 = check_flag(&flag,"ARKodeSetMaxNonlinIters",1);
                    if (iVar3 == 0) {
                      iVar4 = 1;
                      flag = ARKodeSetAutonomous(flagvalue_00,1);
                      iVar3 = check_flag(&flag,"ARKodeSetAutonomous",1);
                      if (iVar3 == 0) {
                        __s = fopen("solution.txt","w");
                        fwrite("# t u v w\n",10,1,__s);
                        puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                        fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                        t = 0.0;
                        puts("        t           u           v           w");
                        puts("   ----------------------------------------------");
                        local_a0 = 1.0;
                        while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
                          flag = ARKodeEvolve(SUB84(local_a0,0),flagvalue_00,flagvalue,&t,1);
                          iVar4 = check_flag(&flag,"ARKodeEvolve",1);
                          if (iVar4 != 0) break;
                          puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",SUB84(t,0),*puVar1,puVar1[1],
                                 puVar1[2]);
                          puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                          fprintf(__s," %.16e %.16e %.16e %.16e\n",SUB84(t,0),*puVar1,puVar1[1],
                                  puVar1[2]);
                          if (flag < 0) {
                            fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                            break;
                          }
                          dVar6 = local_a0 + 1.0;
                          local_a0 = 10.0;
                          if (dVar6 <= 10.0) {
                            local_a0 = dVar6;
                          }
                        }
                        puts("   ----------------------------------------------");
                        fclose(__s);
                        flag = ARKodeGetNumSteps(flagvalue_00,&nst);
                        check_flag(&flag,"ARKodeGetNumSteps",1);
                        flag = ARKodeGetNumStepAttempts(flagvalue_00,&nst_a);
                        check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                        iVar4 = 0;
                        flag = ARKodeGetNumRhsEvals(flagvalue_00,0,&nfe);
                        check_flag(&flag,"ARKodeGetNumRhsEvals",1);
                        flag = ARKodeGetNumRhsEvals(flagvalue_00,1,&nfi);
                        check_flag(&flag,"ARKodeGetNumRhsEvals",1);
                        flag = ARKodeGetNumErrTestFails(flagvalue_00,&netf);
                        check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                        flag = ARKodeGetNumNonlinSolvIters(flagvalue_00,&nni);
                        check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                        flag = ARKodeGetNumNonlinSolvConvFails(flagvalue_00);
                        check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                        puts("\nFinal Solver Statistics:");
                        printf("   Internal solver steps = %li (attempted = %li)\n",nst,nst_a);
                        printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                        printf("   Total number of fixed-point iterations = %li\n",nni);
                        printf("   Total number of nonlinear solver convergence failures = %li\n",
                               ncfn);
                        printf("   Total number of error test failures = %li\n\n",netf);
                        N_VDestroy(flagvalue);
                        ARKodeFree(&local_60);
                        SUNNonlinSolFree(flagvalue_01);
                        SUNLogger_Destroy(&logger);
                        SUNContext_Free(&ctx);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);      /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);       /* time between outputs */
  sunindextype NEQ   = 3;                     /* number of dependent vars. */
  int Nt             = (int)ceil(Tf / dTout); /* number of output times */
  int test           = 3;                     /* test problem to run */
  sunrealtype reltol = 1.0e-6;                /* tolerances */
  sunrealtype abstol = 1.0e-10;
  int fp_m           = 3;  /* dimension of acceleration subspace */
  int maxcor         = 10; /* maximum # of nonlinear iterations/step */
  sunrealtype a, b, ep, u0, v0, w0;
  sunrealtype rdata[3];
  int monitor = 0; /* turn on/off monitoring */

  /* general problem variables */
  SUNContext ctx         = NULL;
  SUNLogger logger       = NULL;
  const char* info_fname = "ark_brusselator_fp-info.txt";
  int flag;                      /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  SUNNonlinearSolver NLS = NULL; /* empty nonlinear solver object */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nni, ncfn, netf;

  /* read inputs */
  if (argc == 2) { monitor = atoi(argv[1]); }

  /* create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  flag = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_flag(&flag, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    flag = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_flag(&flag, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  flag = SUNContext_SetLogger(ctx, logger);
  if (check_flag(&flag, "SUNContext_SetLogger", 1)) { return 1; }

  /* set up the test problem according to the desired test */
  if (test == 1)
  {
    u0 = SUN_RCONST(3.9);
    v0 = SUN_RCONST(1.1);
    w0 = SUN_RCONST(2.8);
    a  = SUN_RCONST(1.2);
    b  = SUN_RCONST(2.5);
    ep = SUN_RCONST(1.0e-5);
  }
  else if (test == 3)
  {
    u0 = SUN_RCONST(3.0);
    v0 = SUN_RCONST(3.0);
    w0 = SUN_RCONST(3.5);
    a  = SUN_RCONST(0.5);
    b  = SUN_RCONST(3.0);
    ep = SUN_RCONST(5.0e-4);
  }
  else
  {
    u0 = SUN_RCONST(1.2);
    v0 = SUN_RCONST(3.1);
    w0 = SUN_RCONST(3.0);
    a  = SUN_RCONST(1.0);
    b  = SUN_RCONST(3.5);
    ep = SUN_RCONST(5.0e-6);
  }

  /* Initial problem output */
  printf("\nBrusselator ODE test problem, fixed-point solver:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  rdata[0] = a; /* set user data  */
  rdata[1] = b;
  rdata[2] = ep;
  y        = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side functions in y'=fe(t,y)+fi(t,y),
     the initial time T0, and the initial dependent variable vector y. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Initialize fixed-point nonlinear solver and attach to ARKODE */
  NLS = SUNNonlinSol_FixedPoint(y, fp_m, ctx);
  if (check_flag((void*)NLS, "SUNNonlinSol_FixedPoint", 0)) { return 1; }

  flag = ARKodeSetNonlinearSolver(arkode_mem, NLS);
  if (check_flag(&flag, "ARKodeSetNonlinearSolver", 1)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)rdata); /* Pass rdata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  flag = ARKodeSetMaxNonlinIters(arkode_mem,
                                 maxcor); /* Increase default iterations */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }

  flag = ARKodeSetAutonomous(arkode_mem, SUNTRUE);
  if (check_flag(&flag, "ARKodeSetAutonomous", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total number of fixed-point iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y);
  ARKodeFree(&arkode_mem);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&ctx);

  return 0;
}